

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void am_write_command_name(Am_Object *cmd,int cnt,ostrstream *oss)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  ostream *poVar4;
  bool local_c5;
  bool local_c3;
  Am_Object local_78;
  Am_Value local_70;
  Am_Object object_modified;
  Am_Value new_value;
  undefined1 local_40 [8];
  Am_Value object_modified_value;
  Am_Value v;
  ostrstream *oss_local;
  int cnt_local;
  Am_Object *cmd_local;
  
  Am_Value::Am_Value((Am_Value *)&object_modified_value.value);
  Am_Value::Am_Value((Am_Value *)local_40);
  Am_Value::Am_Value((Am_Value *)&object_modified);
  Am_Object::Am_Object((Am_Object *)&local_70.value);
  pAVar3 = Am_Object::Peek(cmd,0x151,4);
  Am_Value::operator=((Am_Value *)&object_modified_value.value,pAVar3);
  bVar1 = Am_Value::Valid((Am_Value *)&object_modified_value.value);
  if (!bVar1) {
    pAVar3 = Am_Object::Peek(cmd,0x150,4);
    Am_Value::operator=((Am_Value *)&object_modified_value.value,pAVar3);
  }
  pAVar3 = Am_Object::Peek(cmd,0x16d,4);
  Am_Value::operator=((Am_Value *)local_40,pAVar3);
  pAVar3 = Am_Object::Peek(cmd,0x169,4);
  Am_Value::operator=((Am_Value *)&object_modified,pAVar3);
  std::ostream::operator<<(oss,cnt);
  poVar4 = std::operator<<((ostream *)oss,". ");
  poVar4 = operator<<(poVar4,(Am_Value *)&object_modified_value.value);
  std::operator<<(poVar4," ");
  bVar1 = Am_Value::Valid((Am_Value *)local_40);
  if (bVar1) {
    output_obj_or_list(&local_70,(ostrstream *)local_40);
    Am_Object::operator=((Am_Object *)&local_70.value,(Am_Object *)&local_70);
    Am_Object::~Am_Object((Am_Object *)&local_70);
  }
  bVar1 = false;
  bVar2 = Am_Value::Exists((Am_Value *)&object_modified);
  local_c3 = false;
  if (bVar2) {
    bVar2 = Am_Object::Valid((Am_Object *)&local_70.value);
    local_c5 = true;
    if ((bVar2) && (local_c5 = true, (short)object_modified.data == -0x5fff)) {
      Am_Object::Am_Object(&local_78,(Am_Value *)&object_modified);
      bVar1 = true;
      local_c5 = Am_Object::operator!=(&local_78,(Am_Object *)&local_70.value);
    }
    local_c3 = local_c5;
  }
  if (bVar1) {
    Am_Object::~Am_Object(&local_78);
  }
  if (local_c3 != false) {
    poVar4 = std::operator<<((ostream *)oss," = ");
    operator<<(poVar4,(Am_Value *)&object_modified);
  }
  std::ostream::operator<<(oss,std::ends<char,std::char_traits<char>>);
  Am_Object::~Am_Object((Am_Object *)&local_70.value);
  Am_Value::~Am_Value((Am_Value *)&object_modified);
  Am_Value::~Am_Value((Am_Value *)local_40);
  Am_Value::~Am_Value((Am_Value *)&object_modified_value.value);
  return;
}

Assistant:

void
am_write_command_name(Am_Object cmd, int cnt, OSTRSTREAM &oss)
{
  Am_Value v, object_modified_value, new_value;
  Am_Object object_modified;
  v = cmd.Peek(Am_SHORT_LABEL, Am_NO_DEPENDENCY);
  if (!v.Valid())
    v = cmd.Peek(Am_LABEL, Am_NO_DEPENDENCY);
  object_modified_value = cmd.Peek(Am_OBJECT_MODIFIED, Am_NO_DEPENDENCY);
  new_value = cmd.Peek(Am_VALUE, Am_NO_DEPENDENCY);
  oss << cnt;
  oss << ". " << v << " ";
  if (object_modified_value.Valid())
    object_modified = output_obj_or_list(object_modified_value, oss);
  if (new_value.Exists() &&
      (!object_modified.Valid() || new_value.type != Am_OBJECT ||
       Am_Object(new_value) != object_modified)) {
    //don't output new_value if same as object_modified (as in create commands)
    oss << " = " << new_value;
  }
  oss << std::ends;
}